

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecvt.cpp
# Opt level: O0

locale booster::locale::impl_icu::create_codecvt
                 (locale *in,string *encoding,character_facet_type type)

{
  bool bVar1;
  _Impl *in_RDI;
  exception *anon_var_0_1;
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  cvt;
  invalid_charset_error *anon_var_0;
  char *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  _Impl *ccharset;
  undefined4 in_stack_ffffffffffffff84;
  uint type_00;
  locale *in_stack_ffffffffffffff88;
  character_facet_type in_stack_ffffffffffffffbc;
  string *in_stack_ffffffffffffffc0;
  locale *in_stack_ffffffffffffffc8;
  
  ccharset = in_RDI;
  std::__cxx11::string::c_str();
  conv::impl::normalize_encoding_abi_cxx11_((char *)ccharset);
  bVar1 = std::operator==(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  type_00 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff84);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  if ((type_00 & 0x1000000) == 0) {
    util::create_simple_codecvt
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  else {
    util::create_utf8_codecvt(in_stack_ffffffffffffff88,type_00);
  }
  return (locale)in_RDI;
}

Assistant:

std::locale create_codecvt(std::locale const &in,std::string const &encoding,character_facet_type type)
    {
        if(conv::impl::normalize_encoding(encoding.c_str())=="utf8")
            return util::create_utf8_codecvt(in,type);

        try {
            return util::create_simple_codecvt(in,encoding,type);
        }
        catch(booster::locale::conv::invalid_charset_error const &) {
            std::unique_ptr<util::base_converter> cvt;
            try {
                cvt = create_uconv_converter(encoding);
            }
            catch(std::exception const &/*e*/)
            {
                cvt.reset(new util::base_converter());
            }
            return util::create_codecvt(in,std::move(cvt),type);
        }
    }